

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  ImVec4 *pIVar4;
  ImDrawCmd local_38;
  
  local_38.ElemCount = 0;
  local_38.UserCallback = (ImDrawCallback)0x0;
  local_38.UserCallbackData = (void *)0x0;
  lVar3 = (long)(this->_ClipRectStack).Size;
  pIVar4 = (this->_ClipRectStack).Data + lVar3 + -1;
  if (lVar3 == 0) {
    pIVar4 = &this->_Data->ClipRectFullscreen;
  }
  uVar1 = pIVar4->x;
  uVar2 = pIVar4->y;
  local_38.ClipRect.z = pIVar4->z;
  local_38.ClipRect.w = pIVar4->w;
  lVar3 = (long)(this->_TextureIdStack).Size;
  if (lVar3 == 0) {
    local_38.TextureId = (void *)0x0;
  }
  else {
    local_38.TextureId = (this->_TextureIdStack).Data[lVar3 + -1];
  }
  local_38.VtxOffset = this->_VtxCurrentOffset;
  local_38.IdxOffset = (this->IdxBuffer).Size;
  local_38.ClipRect.x = (float)uVar1;
  local_38.ClipRect.y = (float)uVar2;
  if (((float)uVar1 <= local_38.ClipRect.z) && ((float)uVar2 <= local_38.ClipRect.w)) {
    ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&local_38);
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                ,0x19e,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();
    draw_cmd.VtxOffset = _VtxCurrentOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}